

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisCheckErrorConditions
          (ZydisDecoderState *state,ZydisDecodedInstruction *instruction,
          ZydisInstructionDefinition *definition)

{
  ZyanBool ZVar1;
  ZyanU8 ZVar2;
  ZyanU8 ZVar3;
  ZyanU8 ZVar4;
  ZydisDecoderContext *context_00;
  undefined1 uVar5;
  undefined1 uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  ZyanU8 local_77;
  ZyanU8 local_76;
  ZyanU8 source2_1;
  ZyanU8 source1_1;
  ZyanU8 dest_2;
  ZyanU8 source2;
  ZyanU8 source1;
  ZyanU8 dest_1;
  ZyanU8 mask;
  ZyanU8 dest;
  ZyanU8 index;
  ZyanStatus status_047620348;
  ZyanBool is_rip_rel;
  ZyanU8 is_sr_dest_rm;
  ZyanU8 is_sr_dest_reg;
  ZyanU8 no_rip_rel;
  ZyanBool is_reg;
  ZydisDecoderContext *context;
  ZydisInstructionDefinitionMVEX *def_4;
  ZydisInstructionDefinitionEVEX *def_3;
  ZydisInstructionDefinitionVEX *def_2;
  ZydisInstructionDefinitionXOP *def_1;
  ZydisInstructionDefinitionLEGACY *def;
  byte local_2e;
  byte local_2d;
  ZydisMaskPolicy mask_policy;
  ZyanBool no_source_source_match;
  ZyanBool no_source_dest_match;
  ZyanBool is_gather;
  ZyanU8 def_ndsndd;
  ZyanU8 def_rm;
  ZyanU8 def_reg;
  ZydisInstructionDefinition *definition_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1101,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1102,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (definition == (ZydisInstructionDefinition *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1103,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar8 = *(uint *)&definition->field_0x8 >> 0xd;
  uVar5 = (undefined1)uVar8;
  mask_policy._3_1_ = uVar5 & 0x1f;
  uVar9 = *(uint *)&definition->field_0x8 >> 0x12;
  uVar6 = (undefined1)uVar9;
  mask_policy._2_1_ = uVar6 & 0x1f;
  mask_policy._1_1_ = ZYDIS_MASK_POLICY_INVALID >> 8;
  mask_policy._0_1_ = ZYDIS_MASK_POLICY_INVALID;
  local_2d = 0;
  local_2e = 0;
  uVar7 = 0;
  switch(instruction->encoding) {
  case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    if (((*(ulong *)definition >> 0x2d & 1) != 0) &&
       (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE)) {
      return 0x80200001;
    }
    if (((*(ulong *)definition >> 0x2e & 1) != 0) &&
       ((instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_16 ||
        (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_32)))) {
      return 0x80200001;
    }
    if (((state->prefixes).has_lock != '\0') && (-1 < *(int *)&definition->field_0x8)) {
      return 0x80200004;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    break;
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    mask_policy._1_1_ = (char)(*(uint5 *)&definition->field_0x8 >> 0x1e) & 0x1f;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    mask_policy._1_1_ = (char)(*(uint6 *)&definition->field_0x8 >> 0x1e) & 0x1f;
    mask_policy._0_1_ = *(byte *)(definition + 1) >> 3 & ZYDIS_MASK_POLICY_ALLOWED;
    local_2e = *(byte *)(definition + 1) >> 5 & 1;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    mask_policy._1_1_ = (char)(*(uint5 *)&definition->field_0x8 >> 0x1e) & 0x1f;
    mask_policy._0_1_ = *(byte *)(definition + 1) >> 3 & ZYDIS_MASK_POLICY_ALLOWED;
    local_2d = *(byte *)(definition + 1) >> 4 & 1;
    uVar7 = (ushort)((byte)(*(ushort *)&definition[1].field_0x2 >> 2) & 3);
    if (((instruction->raw).field_3.xop.offset != '\0') &&
       ((*(ushort *)&definition[1].field_0x2 >> 4 & 1) == 0)) {
      return 0x8020000a;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    mask_policy._1_1_ = (char)(*(uint7 *)&definition->field_0x8 >> 0x1e) & 0x1f;
    mask_policy._0_1_ = *(byte *)(definition + 1) >> 3 & ZYDIS_MASK_POLICY_ALLOWED;
    uVar7 = *(ushort *)(definition + 1) >> 0xb & 3;
    if (0x19 < ((byte)(*(ushort *)(definition + 1) >> 6) & 0x1f)) {
      __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1192,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (7 < (instruction->raw).field_3.vex.size) {
      __assert_fail("instruction->raw.mvex.SSS < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1193,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZydisCheckErrorConditions::lookup[(byte)(*(ushort *)(definition + 1) >> 6) & 0x1f]
        [(instruction->raw).field_3.vex.size] == '\0') {
      return 0x80200001;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x119e,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  context_00 = state->context;
  ZVar1 = (context_00->reg_info).is_mod_reg;
  status_047620348._2_1_ = 0;
  status_047620348._1_1_ = '\0';
  status_047620348._0_1_ = '\0';
  if ((uVar8 & 0x1f) != 0) {
    status_047620348._1_1_ = (char)((int)(uint)(byte)mask_policy._3_1_ >> 4);
    mask_policy._3_1_ = uVar5 & 0xf;
  }
  if ((uVar9 & 0x1f) != 0) {
    if (ZVar1 == '\0') {
      status_047620348._2_1_ = (byte)((int)(uint)(byte)mask_policy._2_1_ >> 3) & 1;
      mask_policy._2_1_ = uVar6 & 7;
    }
    else {
      status_047620348._0_1_ = (char)((int)(uint)(byte)mask_policy._2_1_ >> 4);
      mask_policy._2_1_ = uVar6 & 0xf;
    }
  }
  if (status_047620348._2_1_ != 0) {
    bVar10 = false;
    if ((state->decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
       (bVar10 = false, (instruction->raw).modrm.mod == '\0')) {
      bVar10 = (instruction->raw).modrm.rm == '\x05';
    }
    if (bVar10) {
      return 0x80200003;
    }
  }
  state_local._4_4_ =
       ZydisPopulateRegisterIds
                 (context_00,instruction,mask_policy._3_1_,mask_policy._2_1_,mask_policy._1_1_);
  if ((state_local._4_4_ & 0x80000000) == 0) {
    if ((status_047620348._1_1_ == '\0') || ((context_00->reg_info).id_reg != '\x01')) {
      if (((char)status_047620348 == '\0') || ((context_00->reg_info).id_rm != '\x01')) {
        if ((undefined1)mask_policy != ZYDIS_MASK_POLICY_INVALID) {
          if ((instruction->raw).modrm.mod == '\x03') {
            __assert_fail("instruction->raw.modrm.mod != 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x11d7,
                          "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((instruction->raw).modrm.rm != '\x04') {
            __assert_fail("instruction->raw.modrm.rm == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x11d8,
                          "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          ZVar2 = (context_00->reg_info).id_index;
          local_76 = (context_00->reg_info).id_reg;
          local_77 = 0xf0;
          if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
            if (((mask_policy._3_1_ != 4) || (mask_policy._2_1_ != 4)) || (mask_policy._1_1_ != 4))
            {
              __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x11e2,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            local_77 = (context_00->reg_info).id_ndsndd;
          }
          if ((instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
             (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)) {
            if (((mask_policy._3_1_ != ZYDIS_MASK_POLICY_INVALID >> 0x18) &&
                (mask_policy._3_1_ != 4)) ||
               ((mask_policy._2_1_ != 4 || (mask_policy._1_1_ != ZYDIS_MASK_POLICY_INVALID >> 8))))
            {
              __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x11ec,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (mask_policy._3_1_ == ZYDIS_MASK_POLICY_INVALID >> 0x18) {
              local_76 = 0xf1;
            }
          }
          if (((local_76 == ZVar2) || (local_76 == local_77)) || (ZVar2 == local_77)) {
            return 0x80200003;
          }
        }
        if (local_2d != 0) {
          if ((instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) &&
             (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS)) {
            __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x1202,
                          "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          ZVar2 = (context_00->reg_info).id_reg;
          if ((ZVar2 == (context_00->reg_info).id_ndsndd) ||
             ((ZVar1 != '\0' && (ZVar2 == (context_00->reg_info).id_rm)))) {
            return 0x80200003;
          }
        }
        if (local_2e != 0) {
          if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
            __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x1212,
                          "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (ZVar1 == '\0') {
            __assert_fail("is_reg",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x1213,
                          "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          ZVar2 = (context_00->reg_info).id_reg;
          ZVar3 = (context_00->reg_info).id_ndsndd;
          ZVar4 = (context_00->reg_info).id_rm;
          if (((ZVar2 == ZVar3) || (ZVar2 == ZVar4)) || (ZVar3 == ZVar4)) {
            return 0x80200003;
          }
        }
        if (1 < uVar7) {
          if (uVar7 == 2) {
            if ((context_00->vector_unified).mask == '\0') {
              return 0x8020000a;
            }
          }
          else {
            if (uVar7 != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x1234,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((context_00->vector_unified).mask != '\0') {
              return 0x8020000a;
            }
          }
        }
        state_local._4_4_ = 0x100000;
      }
      else {
        state_local._4_4_ = 0x80200003;
      }
    }
    else {
      state_local._4_4_ = 0x80200003;
    }
  }
  return state_local._4_4_;
}

Assistant:

static ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState* state,
    const ZydisDecodedInstruction* instruction, const ZydisInstructionDefinition* definition)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(definition);

    ZyanU8 def_reg                  = definition->op_reg;
    ZyanU8 def_rm                   = definition->op_rm;
    ZyanU8 def_ndsndd               = ZYDIS_REGKIND_INVALID;
    ZyanBool is_gather              = ZYAN_FALSE;
    ZyanBool no_source_dest_match   = ZYAN_FALSE;
    ZyanBool no_source_source_match = ZYAN_FALSE;
#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
    ZydisMaskPolicy mask_policy     = ZYDIS_MASK_POLICY_INVALID;
#endif

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    {
        const ZydisInstructionDefinitionLEGACY* def =
            (const ZydisInstructionDefinitionLEGACY*)definition;

        if (def->requires_protected_mode &&
            (instruction->machine_mode == ZYDIS_MACHINE_MODE_REAL_16))
        {
            return ZYDIS_STATUS_DECODING_ERROR;
        }

        if (def->no_compat_mode &&
            ((instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_16) ||
             (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_32)))
        {
            return ZYDIS_STATUS_DECODING_ERROR;
        }

        if (state->prefixes.has_lock && !def->accepts_LOCK)
        {
            return ZYDIS_STATUS_ILLEGAL_LOCK;
        }
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    {
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
    {
        const ZydisInstructionDefinitionXOP* def =
            (const ZydisInstructionDefinitionXOP*)definition;
        def_ndsndd = def->op_ndsndd;
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
    {
        const ZydisInstructionDefinitionVEX* def =
            (const ZydisInstructionDefinitionVEX*)definition;
        def_ndsndd             = def->op_ndsndd;
        is_gather              = def->is_gather;
        no_source_source_match = def->no_source_source_match;
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    {
#ifndef ZYDIS_DISABLE_AVX512
        const ZydisInstructionDefinitionEVEX* def =
            (const ZydisInstructionDefinitionEVEX*)definition;
        def_ndsndd           = def->op_ndsndd;
        is_gather            = def->is_gather;
        no_source_dest_match = def->no_source_dest_match;
        mask_policy          = def->mask_policy;

        // Check for invalid zero-mask
        if ((instruction->raw.evex.z) && (!def->accepts_zero_mask))
        {
            return ZYDIS_STATUS_INVALID_MASK; // TODO: Dedicated status code
        }
#else
        ZYAN_UNREACHABLE;
#endif
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
    {
#ifndef ZYDIS_DISABLE_KNC
        const ZydisInstructionDefinitionMVEX* def =
            (const ZydisInstructionDefinitionMVEX*)definition;
        def_ndsndd  = def->op_ndsndd;
        is_gather   = def->is_gather;
        mask_policy = def->mask_policy;

        // Check for invalid MVEX.SSS values
        static const ZyanU8 lookup[26][8] =
        {
            // ZYDIS_MVEX_FUNC_IGNORED
            { 1, 1, 1, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_INVALID
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_RC
            { 1, 1, 1, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_SAE
            { 1, 1, 1, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_F_32
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_I_32
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_F_64
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_I_64
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_SWIZZLE_32
            { 1, 1, 1, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_SWIZZLE_64
            { 1, 1, 1, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_SF_32
            { 1, 1, 1, 1, 1, 0, 1, 1 },
            // ZYDIS_MVEX_FUNC_SF_32_BCST
            { 1, 1, 1, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_SF_32_BCST_4TO16
            { 1, 0, 1, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_SF_64
            { 1, 1, 1, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_SI_32
            { 1, 1, 1, 0, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_SI_32_BCST
            { 1, 1, 1, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_SI_32_BCST_4TO16
            { 1, 0, 1, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_SI_64
            { 1, 1, 1, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_UF_32
            { 1, 0, 0, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_UF_64
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_UI_32
            { 1, 0, 0, 0, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_UI_64
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_DF_32
            { 1, 0, 0, 1, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_DF_64
            { 1, 0, 0, 0, 0, 0, 0, 0 },
            // ZYDIS_MVEX_FUNC_DI_32
            { 1, 0, 0, 0, 1, 1, 1, 1 },
            // ZYDIS_MVEX_FUNC_DI_64
            { 1, 0, 0, 0, 0, 0, 0, 0 }
        };
        ZYAN_ASSERT(def->functionality < ZYAN_ARRAY_LENGTH(lookup));
        ZYAN_ASSERT(instruction->raw.mvex.SSS < 8);
        if (!lookup[def->functionality][instruction->raw.mvex.SSS])
        {
            return ZYDIS_STATUS_DECODING_ERROR;
        }
#else
        ZYAN_UNREACHABLE;
#endif
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    ZydisDecoderContext* context = state->context;
    const ZyanBool is_reg = context->reg_info.is_mod_reg;

    ZyanU8 no_rip_rel     = ZYAN_FALSE;
    ZyanU8 is_sr_dest_reg = ZYAN_FALSE;
    ZyanU8 is_sr_dest_rm  = ZYAN_FALSE;
    if (def_reg)
    {
        is_sr_dest_reg = ZYDIS_OPDEF_GET_REG_HIGH_BIT(def_reg);
        def_reg = ZYDIS_OPDEF_GET_REG(def_reg);
    }
    if (def_rm)
    {
        if (is_reg)
        {
            is_sr_dest_rm = ZYDIS_OPDEF_GET_REG_HIGH_BIT(def_rm);
            def_rm = ZYDIS_OPDEF_GET_REG(def_rm);
        }
        else
        {
            no_rip_rel = ZYDIS_OPDEF_GET_MEM_HIGH_BIT(def_rm);
            def_rm = ZYDIS_OPDEF_GET_MEM(def_rm);
        }
    }

    // Check RIP-relative memory addressing
    if (no_rip_rel)
    {
        const ZyanBool is_rip_rel =
            (state->decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
            (instruction->raw.modrm.mod == 0) && (instruction->raw.modrm.rm == 5);
        if (is_rip_rel)
        {
            return ZYDIS_STATUS_BAD_REGISTER;
        }
    }

    // Populate- and validate register constraints
    ZYAN_CHECK(ZydisPopulateRegisterIds(context, instruction, def_reg, def_rm, def_ndsndd));

    // `ZYDIS_REGISTER_CS` is not allowed as `MOV` target
    if (is_sr_dest_reg && (context->reg_info.id_reg == 1))
    {
        return ZYDIS_STATUS_BAD_REGISTER;
    }
    if (is_sr_dest_rm && (context->reg_info.id_rm == 1))
    {
        return ZYDIS_STATUS_BAD_REGISTER;
    }

    // Check gather registers
    if (is_gather)
    {
        // ZYAN_ASSERT(has_VSIB);
        ZYAN_ASSERT(instruction->raw.modrm.mod != 3);
        ZYAN_ASSERT(instruction->raw.modrm.rm  == 4);

        const ZyanU8 index = context->reg_info.id_index;
        ZyanU8 dest        = context->reg_info.id_reg;
        ZyanU8 mask        = 0xF0;

        if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)
        {
            ZYAN_ASSERT((def_reg    == ZYDIS_REGKIND_VR) &&
                        (def_rm     == ZYDIS_MEMOP_TYPE_VSIB) &&
                        (def_ndsndd == ZYDIS_REGKIND_VR));
            mask = context->reg_info.id_ndsndd;
        }

        if ((instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            ZYAN_ASSERT(((def_reg    == ZYDIS_REGKIND_INVALID) ||
                         (def_reg    == ZYDIS_REGKIND_VR)) &&
                         (def_rm     == ZYDIS_MEMOP_TYPE_VSIB) &&
                         (def_ndsndd == ZYDIS_REGKIND_INVALID));

            // Some gather instructions (like `VGATHERPF0{D|Q}{PS|PD}`) do not have a destination
            // operand
            if (!def_reg)
            {
                dest = 0xF1;
            }
        }

        // If any pair of the index, mask, or destination registers are the same, the instruction
        // results a UD fault
        if ((dest == index) || (dest == mask) || (index == mask))
        {
            return ZYDIS_STATUS_BAD_REGISTER;
        }
    }

    // Check if any source register matches the destination register
    if (no_source_dest_match)
    {
        ZYAN_ASSERT((instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
                    (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX));

        const ZyanU8 dest    = context->reg_info.id_reg;
        const ZyanU8 source1 = context->reg_info.id_ndsndd;
        const ZyanU8 source2 = context->reg_info.id_rm;

        if ((dest == source1) || (is_reg && (dest == source2)))
        {
            return ZYDIS_STATUS_BAD_REGISTER;
        }
    }

    // If any pair of the source or destination registers are the same, the instruction results a
    // UD fault
    if (no_source_source_match) // TODO: Find better name
    {
        ZYAN_ASSERT(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX);
        ZYAN_ASSERT(is_reg);

        const ZyanU8 dest    = context->reg_info.id_reg;
        const ZyanU8 source1 = context->reg_info.id_ndsndd;
        const ZyanU8 source2 = context->reg_info.id_rm;

        if ((dest == source1) || (dest == source2) || (source1 == source2))
        {
            return ZYDIS_STATUS_BAD_REGISTER;
        }
    }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
    // Check for invalid MASK registers
    switch (mask_policy)
    {
    case ZYDIS_MASK_POLICY_INVALID:
    case ZYDIS_MASK_POLICY_ALLOWED:
        // Nothing to do here
        break;
    case ZYDIS_MASK_POLICY_REQUIRED:
        if (!context->vector_unified.mask)
        {
            return ZYDIS_STATUS_INVALID_MASK;
        }
        break;
    case ZYDIS_MASK_POLICY_FORBIDDEN:
        if (context->vector_unified.mask)
        {
            return ZYDIS_STATUS_INVALID_MASK;
        }
        break;
    default:
        ZYAN_UNREACHABLE;
    }
#endif

    return ZYAN_STATUS_SUCCESS;
}